

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5Array.cpp
# Opt level: O0

bool __thiscall
Js::ES5Array::GetPropertyBuiltIns(ES5Array *this,PropertyId propertyId,Var *value,BOOL *result)

{
  uint32 nValue;
  ScriptContext *scriptContext;
  Var pvVar1;
  BOOL *result_local;
  Var *value_local;
  PropertyId propertyId_local;
  ES5Array *this_local;
  
  if (propertyId == 0xd1) {
    nValue = ArrayObject::GetLength((ArrayObject *)this);
    scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    pvVar1 = JavascriptNumber::ToVar(nValue,scriptContext);
    *value = pvVar1;
    *result = 1;
  }
  return propertyId == 0xd1;
}

Assistant:

bool ES5Array::GetPropertyBuiltIns(PropertyId propertyId, Var* value, BOOL* result)
    {
        if (propertyId == PropertyIds::length)
        {
            *value = JavascriptNumber::ToVar(this->GetLength(), GetScriptContext());
            *result = true;
            return true;
        }

        return false;
    }